

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qexception.cpp
# Opt level: O3

void __thiscall
QUnhandledException::QUnhandledException(QUnhandledException *this,QUnhandledException *other)

{
  long in_FS_OFFSET;
  QSharedDataPointer<QUnhandledExceptionPrivate> local_20;
  QSharedDataPointer<QUnhandledExceptionPrivate> local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this->super_QException = (QException)&PTR__QUnhandledException_0069e5b8;
  (this->d).d.ptr = (other->d).d.ptr;
  local_20.d.ptr =
       (totally_ordered_wrapper<QUnhandledExceptionPrivate_*>)(QUnhandledExceptionPrivate *)0x0;
  (other->d).d.ptr = (QUnhandledExceptionPrivate *)0x0;
  local_18.d.ptr =
       (totally_ordered_wrapper<QUnhandledExceptionPrivate_*>)(QUnhandledExceptionPrivate *)0x0;
  QSharedDataPointer<QUnhandledExceptionPrivate>::~QSharedDataPointer(&local_18);
  QSharedDataPointer<QUnhandledExceptionPrivate>::~QSharedDataPointer(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QUnhandledException::QUnhandledException(QUnhandledException &&other) noexcept
    : d(std::exchange(other.d, {}))
{
}